

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.cpp
# Opt level: O1

void __thiscall BamTools::SamSequence::SamSequence(SamSequence *this,string *name,string *length)

{
  pointer pcVar1;
  char *__end;
  
  (this->AssemblyID)._M_dataplus._M_p = (pointer)&(this->AssemblyID).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"","");
  (this->Checksum)._M_dataplus._M_p = (pointer)&(this->Checksum).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Checksum,"","");
  (this->Length)._M_dataplus._M_p = (pointer)&(this->Length).field_2;
  pcVar1 = (length->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Length,pcVar1,pcVar1 + length->_M_string_length);
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Name,pcVar1,pcVar1 + name->_M_string_length);
  (this->Species)._M_dataplus._M_p = (pointer)&(this->Species).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Species,"");
  (this->URI)._M_dataplus._M_p = (pointer)&(this->URI).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->URI,"");
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SamSequence::SamSequence(const std::string& name,
                         const std::string& length)
    : AssemblyID("")
    , Checksum("")
    , Length(length)
    , Name(name)
    , Species("")
    , URI("")
{ }